

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O1

void __thiscall
llm_tokenizer_bpe_session::tokenize
          (llm_tokenizer_bpe_session *this,string *text,vector<int,_std::allocator<int>_> *output)

{
  pointer *pplVar1;
  vector<llm_symbol,_std::allocator<llm_symbol>_> *this_00;
  long lVar2;
  int *piVar3;
  iterator iVar4;
  size_type sVar5;
  long lVar6;
  pointer plVar7;
  pointer plVar8;
  iterator iVar9;
  index iVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  llama_token lVar13;
  int iVar14;
  pointer plVar15;
  int iVar16;
  pointer text_00;
  int iVar17;
  llm_symbol *sym_1;
  size_type sVar18;
  queue *this_01;
  pointer plVar19;
  bool bVar20;
  llm_symbol sym;
  string left_token;
  vector<llm_symbol,_std::allocator<llm_symbol>_> *__range2;
  string right_token;
  llama_token token_multibyte;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  word_collection;
  undefined1 local_118 [16];
  undefined1 local_108 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  vector<llm_symbol,std::allocator<llm_symbol>> *local_b0;
  vector<int,std::allocator<int>> *local_a8;
  vector<llm_symbol,std::allocator<llm_symbol>> *local_a0;
  queue *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_a8 = (vector<int,std::allocator<int>> *)output;
  unicode_regex_split(&local_48,(string *)text,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&this->tokenizer->regex_exprs);
  plVar19 = (this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar19) {
    (this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
    super__Vector_impl_data._M_finish = plVar19;
  }
  local_a0 = (vector<llm_symbol,std::allocator<llm_symbol>> *)&this->symbols_final;
  local_70 = (string *)
             local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_98 = &this->work_queue;
    local_b0 = (vector<llm_symbol,std::allocator<llm_symbol>> *)&this->symbols;
    iVar16 = -1;
    text_00 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_108._8_8_ = 0;
      local_d8._M_dataplus._M_p =
           (pointer)(this->work_queue).
                    super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
                    .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_d8._M_string_length =
           (size_type)
           (this->work_queue).
           super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
           .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_d8.field_2._M_allocated_capacity =
           (size_type)
           (this->work_queue).
           super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
           .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (this->work_queue).
      super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
      .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->work_queue).
      super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
      .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->work_queue).
      super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
      .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_118._0_8_ = (pointer)0x0;
      local_118._8_8_ = (char *)0x0;
      local_108._0_8_ = (pointer)0x0;
      llama_vocab::std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>::~vector
                ((vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_> *)&local_d8);
      llama_vocab::std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>::~vector
                ((vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_> *)local_118);
      plVar19 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
          super__Vector_impl_data._M_finish != plVar19) {
        (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
        super__Vector_impl_data._M_finish = plVar19;
      }
      if ((((this->vocab->pimpl)._M_t.
            super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t.
            super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
            super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl)->ignore_merges == true)
         && (lVar13 = llama_vocab::text_to_token(this->vocab,(string *)text_00), lVar13 != -1)) {
        local_118._0_8_ = (pointer)0xffffffffffffffff;
        local_118._8_8_ = (((string *)text_00)->_M_dataplus)._M_p;
        local_108._0_8_ = ((string *)text_00)->_M_string_length;
        iVar4._M_current =
             (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::
          _M_realloc_insert<llm_symbol>
                    ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)local_b0,iVar4,
                     (llm_symbol *)local_118);
        }
        else {
          (iVar4._M_current)->n = local_108._0_8_;
          local_118._12_4_ = (undefined4)((ulong)local_118._8_8_ >> 0x20);
          (iVar4._M_current)->prev = -1;
          (iVar4._M_current)->next = -1;
          *(undefined4 *)&(iVar4._M_current)->text = local_118._8_4_;
          *(undefined4 *)((long)&(iVar4._M_current)->text + 4) = local_118._12_4_;
          pplVar1 = &(this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *pplVar1 = *pplVar1 + 1;
        }
        sVar18 = ((string *)text_00)->_M_string_length;
      }
      else {
        sVar18 = 0;
      }
      if (sVar18 < ((string *)text_00)->_M_string_length) {
        iVar17 = 1;
        do {
          sVar5 = ((string *)text_00)->_M_string_length;
          plVar15 = (pointer)unicode_len_utf8((((string *)text_00)->_M_dataplus)._M_p[sVar18]);
          local_108._0_8_ = sVar5 - sVar18;
          if (plVar15 < (ulong)local_108._0_8_) {
            local_108._0_8_ = plVar15;
          }
          local_118._8_8_ = (((string *)text_00)->_M_dataplus)._M_p + sVar18;
          sVar18 = (long)&((pointer)local_108._0_8_)->left + sVar18;
          local_118._4_4_ = iVar17;
          if (sVar18 == ((string *)text_00)->_M_string_length) {
            local_118._4_4_ = -1;
          }
          local_118._0_4_ = iVar17 + -2;
          iVar4._M_current =
               (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<llm_symbol,std::allocator<llm_symbol>>::_M_realloc_insert<llm_symbol&>
                      (local_b0,iVar4,(llm_symbol *)local_118);
          }
          else {
            (iVar4._M_current)->n = local_108._0_8_;
            (iVar4._M_current)->prev = iVar17 + -2;
            (iVar4._M_current)->next = local_118._4_4_;
            (iVar4._M_current)->text = (char *)local_118._8_8_;
            pplVar1 = &(this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *pplVar1 = *pplVar1 + 1;
          }
          iVar17 = iVar17 + 1;
        } while (sVar18 < ((string *)text_00)->_M_string_length);
      }
      if (1 < (int)((ulong)((long)(this->symbols).
                                  super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->symbols).
                                 super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        iVar17 = 1;
        do {
          add_new_bigram(this,iVar17 + -1,iVar17);
          iVar17 = iVar17 + 1;
          iVar14 = (int)((ulong)((long)(this->symbols).
                                       super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->symbols).
                                      super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3);
        } while (SBORROW4(iVar17,iVar14 * -0x55555555) != iVar17 + iVar14 * 0x55555555 < 0);
      }
      this_01 = local_98;
      if ((this->work_queue).
          super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
          .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this->work_queue).
          super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
          .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          llama_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
          ::pop_move((llm_bigram_bpe *)local_118,this_01);
          lVar6 = *(long *)local_b0;
          if (*(long *)(lVar6 + 0x10 + (long)(int)local_118._0_4_ * 0x18) != 0) {
            lVar2 = lVar6 + (long)(int)local_118._4_4_ * 0x18;
            if (*(long *)(lVar2 + 0x10) != 0) {
              piVar3 = (int *)(lVar6 + (long)(int)local_118._0_4_ * 0x18);
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d8,*(long *)(piVar3 + 2),
                         *(long *)(piVar3 + 4) + *(long *)(piVar3 + 2));
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_90,*(long *)(lVar2 + 8),
                         *(long *)(lVar2 + 0x10) + *(long *)(lVar2 + 8));
              std::operator+(&local_68,&local_d8,&local_90);
              bVar20 = true;
              if (local_68._M_string_length == local_108._0_8_) {
                if ((pointer)local_68._M_string_length == (pointer)0x0) {
                  bVar20 = false;
                }
                else {
                  iVar17 = bcmp((void *)CONCAT44(local_68._M_dataplus._M_p._4_4_,
                                                 (llama_token)local_68._M_dataplus._M_p),
                                (void *)local_118._8_8_,local_68._M_string_length);
                  bVar20 = iVar17 != 0;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_68._M_dataplus._M_p._4_4_,(llama_token)local_68._M_dataplus._M_p
                             ) != &local_68.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_68._M_dataplus._M_p._4_4_,
                                         (llama_token)local_68._M_dataplus._M_p),
                                local_68.field_2._M_allocated_capacity + 1);
              }
              if (!bVar20) {
                *(long *)(piVar3 + 4) = *(long *)(piVar3 + 4) + *(long *)(lVar2 + 0x10);
                *(undefined8 *)(lVar2 + 0x10) = 0;
                piVar3[1] = *(int *)(lVar2 + 4);
                if (-1 < (long)*(int *)(lVar2 + 4)) {
                  *(undefined4 *)(*(long *)local_b0 + (long)*(int *)(lVar2 + 4) * 0x18) =
                       local_118._0_4_;
                }
                add_new_bigram(this,*piVar3,local_118._0_4_);
                add_new_bigram(this,local_118._0_4_,piVar3[1]);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              this_01 = local_98;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,
                                (ulong)(local_d8.field_2._M_allocated_capacity + 1));
              }
            }
          }
          if ((undefined1 *)local_118._8_8_ != local_108 + 8) {
            operator_delete((void *)local_118._8_8_,local_108._8_8_ + 1);
          }
        } while ((this->work_queue).
                 super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
                 .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
                 super__Vector_impl_data._M_start !=
                 (this->work_queue).
                 super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
                 .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      plVar7 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (plVar19 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                     _M_impl.super__Vector_impl_data._M_start; plVar19 != plVar7;
          plVar19 = plVar19 + 1) {
        if (plVar19->n != 0) {
          plVar19->prev = iVar16;
          plVar19->next = -1;
          if (iVar16 != -1) {
            plVar8 = (this->symbols_final).
                     super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
                     super__Vector_impl_data._M_start;
            plVar8[iVar16].next =
                 (int)((ulong)((long)(this->symbols_final).
                                     super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)plVar8) >> 3)
                 * -0x55555555;
          }
          iVar4._M_current =
               (this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<llm_symbol,std::allocator<llm_symbol>>::_M_realloc_insert<llm_symbol&>
                      (local_a0,iVar4,plVar19);
          }
          else {
            (iVar4._M_current)->n = plVar19->n;
            iVar10 = plVar19->next;
            uVar11 = *(undefined4 *)&plVar19->text;
            uVar12 = *(undefined4 *)((long)&plVar19->text + 4);
            (iVar4._M_current)->prev = plVar19->prev;
            (iVar4._M_current)->next = iVar10;
            *(undefined4 *)&(iVar4._M_current)->text = uVar11;
            *(undefined4 *)((long)&(iVar4._M_current)->text + 4) = uVar12;
            pplVar1 = &(this->symbols_final).
                       super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *pplVar1 = *pplVar1 + 1;
          }
          iVar16 = (int)((ulong)((long)(this->symbols_final).
                                       super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->symbols_final).
                                      super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555
                   + -1;
        }
      }
      text_00 = (pointer)((string *)text_00 + 1);
    } while (text_00 != (pointer)local_70);
  }
  this_00 = &this->symbols;
  llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator=
            (this_00,(vector<llm_symbol,_std::allocator<llm_symbol>_> *)local_a0);
  if ((this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar16 = 0;
    do {
      plVar19 = (this_00->super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (plVar19[iVar16].n != 0) {
        local_118._0_8_ = (pointer)local_108;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,plVar19[iVar16].text,plVar19[iVar16].text + plVar19[iVar16].n
                  );
        lVar13 = llama_vocab::text_to_token(this->vocab,(string *)local_118);
        local_90._M_dataplus._M_p._0_4_ = lVar13;
        if (lVar13 == -1) {
          plVar15 = (pointer)local_118._0_8_;
          if ((char *)local_118._8_8_ != (char *)0x0) {
            do {
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_d8,'\x01');
              local_68._M_dataplus._M_p._0_4_ = llama_vocab::text_to_token(this->vocab,&local_d8);
              if ((llama_token)local_68._M_dataplus._M_p != -1) {
                iVar9._M_current = *(int **)(local_a8 + 8);
                if (iVar9._M_current == *(int **)(local_a8 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_a8,iVar9,(int *)&local_68);
                }
                else {
                  *iVar9._M_current = (llama_token)local_68._M_dataplus._M_p;
                  *(int **)(local_a8 + 8) = iVar9._M_current + 1;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,
                                (ulong)(local_d8.field_2._M_allocated_capacity + 1));
              }
              plVar15 = (pointer)((long)&plVar15->left + 1);
            } while (plVar15 != (pointer)(local_118._0_8_ + local_118._8_8_));
          }
        }
        else {
          iVar9._M_current = *(int **)(local_a8 + 8);
          if (iVar9._M_current == *(int **)(local_a8 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_a8,iVar9,(int *)&local_90);
          }
          else {
            *iVar9._M_current = lVar13;
            *(int **)(local_a8 + 8) = iVar9._M_current + 1;
          }
        }
        if ((pointer)local_118._0_8_ != (pointer)local_108) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_108._0_8_ + 1));
        }
      }
      iVar16 = (this_00->super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>)._M_impl.
               super__Vector_impl_data._M_start[iVar16].next;
    } while (iVar16 != -1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void tokenize(const std::string & text, std::vector<llama_token> & output) {
        int final_prev_index = -1;
        const auto word_collection = unicode_regex_split(text, tokenizer.regex_exprs);

        symbols_final.clear();

        for (const auto & word : word_collection) {
            work_queue = llm_bigram_bpe::queue();
            symbols.clear();

            int index = 0;
            size_t offset = 0;

            //if (vocab.tokenizer_ignore_merges && vocab.token_to_id.find(word) != vocab.token_to_id.end()) {
            if (vocab.get_ignore_merges() && vocab.text_to_token(word) != LLAMA_TOKEN_NULL) {
                symbols.emplace_back(llm_symbol{-1, -1, word.c_str(), word.size()});
                offset = word.size();
            }

            while (offset < word.size()) {
                llm_symbol sym;
                size_t char_len = std::min(word.size() - offset, (size_t) unicode_len_utf8(word[offset]));
                sym.text = word.c_str() + offset;
                sym.n = char_len;
                offset += sym.n;
                sym.prev = index - 1;
                sym.next = offset == word.size() ? -1 : index + 1;
                index++;
                symbols.emplace_back(sym);
            }
            for (int i = 1; i < (int) symbols.size(); ++i) {
                add_new_bigram(i - 1, i);
            }

            // build token(s)
            while (!work_queue.empty()) {
                auto bigram = work_queue.pop_move();

                auto & left_symbol = symbols[bigram.left];
                auto & right_symbol = symbols[bigram.right];

                if (left_symbol.n == 0 || right_symbol.n == 0) {
                    continue;
                }
                std::string left_token = std::string(left_symbol.text, left_symbol.n);
                std::string right_token = std::string(right_symbol.text, right_symbol.n);
                if (left_token + right_token != bigram.text) {
                    continue;  // Skip this bigram if it's outdated
                }

                // merge the right sym into the left one
                left_symbol.n += right_symbol.n;
                right_symbol.n = 0;

                // remove the right sym from the chain
                left_symbol.next = right_symbol.next;
                if (right_symbol.next >= 0) {
                    symbols[right_symbol.next].prev = bigram.left;
                }

                add_new_bigram(left_symbol.prev, bigram.left);  // left side of current symbol
                add_new_bigram(bigram.left, left_symbol.next);  // right side of current symbol
            }

            // add the finished tokens to the final list keeping correct order for next and prev
            for (auto & sym : symbols) {
                if (sym.n > 0) {
                    sym.prev = final_prev_index;
                    sym.next = -1;
                    if (final_prev_index != -1) {
                        symbols_final[final_prev_index].next = symbols_final.size();
                    }
                    symbols_final.emplace_back(sym);
                    final_prev_index = symbols_final.size() - 1;
                }
            }
        }

        symbols = symbols_final;

        if (!symbols.empty()) {
            for (int i = 0; i != -1; i = symbols[i].next) {
                auto & symbol = symbols[i];
                if (symbol.n == 0) {
                    continue;
                }

                const std::string str = std::string(symbol.text, symbol.n);
                const auto token = vocab.text_to_token(str);

                if (token == LLAMA_TOKEN_NULL) {
                    for (auto j = str.begin(); j != str.end(); ++j) {
                        std::string byte_str(1, *j);
                        auto token_multibyte = vocab.text_to_token(byte_str);
                        if (token_multibyte != LLAMA_TOKEN_NULL) {
                            output.push_back(token_multibyte);
                        }
                    }
                } else {
                    output.push_back(token);
                }
            }
        }
    }